

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::RunContext::UnfinishedSections::UnfinishedSections
          (UnfinishedSections *this,SectionInfo *_info,Counts *_prevAssertions,
          double _durationInSeconds)

{
  pointer pcVar1;
  size_t sVar2;
  
  (this->info).name._M_dataplus._M_p = (pointer)&(this->info).name.field_2;
  pcVar1 = (_info->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (_info->name)._M_string_length);
  (this->info).description._M_dataplus._M_p = (pointer)&(this->info).description.field_2;
  pcVar1 = (_info->description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->info).description,pcVar1,
             pcVar1 + (_info->description)._M_string_length);
  (this->info).lineInfo.file._M_dataplus._M_p = (pointer)&(this->info).lineInfo.file.field_2;
  pcVar1 = (_info->lineInfo).file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->info).lineInfo,pcVar1,
             pcVar1 + (_info->lineInfo).file._M_string_length);
  (this->info).lineInfo.line = (_info->lineInfo).line;
  sVar2 = _prevAssertions->failed;
  (this->prevAssertions).passed = _prevAssertions->passed;
  (this->prevAssertions).failed = sVar2;
  (this->prevAssertions).failedButOk = _prevAssertions->failedButOk;
  this->durationInSeconds = _durationInSeconds;
  return;
}

Assistant:

UnfinishedSections( SectionInfo const& _info, Counts const& _prevAssertions, double _durationInSeconds )
            : info( _info ), prevAssertions( _prevAssertions ), durationInSeconds( _durationInSeconds )
            {}